

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

void TIFFReadDirEntryOutputErr
               (TIFF *tif,TIFFReadDirEntryErr err,char *module,char *tagname,int recover)

{
  int recover_local;
  char *tagname_local;
  char *module_local;
  TIFFReadDirEntryErr err_local;
  TIFF *tif_local;
  
  if (recover == 0) {
    switch(err) {
    case TIFFReadDirEntryErrCount:
      TIFFErrorExtR(tif,module,"Incorrect count for \"%s\"",tagname);
      break;
    case TIFFReadDirEntryErrType:
      TIFFErrorExtR(tif,module,"Incompatible type for \"%s\"",tagname);
      break;
    case TIFFReadDirEntryErrIo:
      TIFFErrorExtR(tif,module,"IO error during reading of \"%s\"",tagname);
      break;
    case TIFFReadDirEntryErrRange:
      TIFFErrorExtR(tif,module,"Incorrect value for \"%s\"",tagname);
      break;
    case TIFFReadDirEntryErrPsdif:
      TIFFErrorExtR(tif,module,"Cannot handle different values per sample for \"%s\"",tagname);
      break;
    case TIFFReadDirEntryErrSizesan:
      TIFFErrorExtR(tif,module,"Sanity check on size of \"%s\" value failed",tagname);
      break;
    case TIFFReadDirEntryErrAlloc:
      TIFFErrorExtR(tif,module,"Out of memory reading of \"%s\"",tagname);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                    ,0xf86,
                    "void TIFFReadDirEntryOutputErr(TIFF *, enum TIFFReadDirEntryErr, const char *, const char *, int)"
                   );
    }
  }
  else {
    switch(err) {
    case TIFFReadDirEntryErrCount:
      TIFFWarningExtR(tif,module,"Incorrect count for \"%s\"; tag ignored",tagname);
      break;
    case TIFFReadDirEntryErrType:
      TIFFWarningExtR(tif,module,"Incompatible type for \"%s\"; tag ignored",tagname);
      break;
    case TIFFReadDirEntryErrIo:
      TIFFWarningExtR(tif,module,"IO error during reading of \"%s\"; tag ignored",tagname);
      break;
    case TIFFReadDirEntryErrRange:
      TIFFWarningExtR(tif,module,"Incorrect value for \"%s\"; tag ignored",tagname);
      break;
    case TIFFReadDirEntryErrPsdif:
      TIFFWarningExtR(tif,module,"Cannot handle different values per sample for \"%s\"; tag ignored"
                      ,tagname);
      break;
    case TIFFReadDirEntryErrSizesan:
      TIFFWarningExtR(tif,module,"Sanity check on size of \"%s\" value failed; tag ignored",tagname)
      ;
      break;
    case TIFFReadDirEntryErrAlloc:
      TIFFWarningExtR(tif,module,"Out of memory reading of \"%s\"; tag ignored",tagname);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                    ,0xfb4,
                    "void TIFFReadDirEntryOutputErr(TIFF *, enum TIFFReadDirEntryErr, const char *, const char *, int)"
                   );
    }
  }
  return;
}

Assistant:

static void TIFFReadDirEntryOutputErr(TIFF *tif, enum TIFFReadDirEntryErr err,
                                      const char *module, const char *tagname,
                                      int recover)
{
    if (!recover)
    {
        switch (err)
        {
            case TIFFReadDirEntryErrCount:
                TIFFErrorExtR(tif, module, "Incorrect count for \"%s\"",
                              tagname);
                break;
            case TIFFReadDirEntryErrType:
                TIFFErrorExtR(tif, module, "Incompatible type for \"%s\"",
                              tagname);
                break;
            case TIFFReadDirEntryErrIo:
                TIFFErrorExtR(tif, module, "IO error during reading of \"%s\"",
                              tagname);
                break;
            case TIFFReadDirEntryErrRange:
                TIFFErrorExtR(tif, module, "Incorrect value for \"%s\"",
                              tagname);
                break;
            case TIFFReadDirEntryErrPsdif:
                TIFFErrorExtR(
                    tif, module,
                    "Cannot handle different values per sample for \"%s\"",
                    tagname);
                break;
            case TIFFReadDirEntryErrSizesan:
                TIFFErrorExtR(tif, module,
                              "Sanity check on size of \"%s\" value failed",
                              tagname);
                break;
            case TIFFReadDirEntryErrAlloc:
                TIFFErrorExtR(tif, module, "Out of memory reading of \"%s\"",
                              tagname);
                break;
            default:
                assert(0); /* we should never get here */
                break;
        }
    }
    else
    {
        switch (err)
        {
            case TIFFReadDirEntryErrCount:
                TIFFWarningExtR(tif, module,
                                "Incorrect count for \"%s\"; tag ignored",
                                tagname);
                break;
            case TIFFReadDirEntryErrType:
                TIFFWarningExtR(tif, module,
                                "Incompatible type for \"%s\"; tag ignored",
                                tagname);
                break;
            case TIFFReadDirEntryErrIo:
                TIFFWarningExtR(
                    tif, module,
                    "IO error during reading of \"%s\"; tag ignored", tagname);
                break;
            case TIFFReadDirEntryErrRange:
                TIFFWarningExtR(tif, module,
                                "Incorrect value for \"%s\"; tag ignored",
                                tagname);
                break;
            case TIFFReadDirEntryErrPsdif:
                TIFFWarningExtR(tif, module,
                                "Cannot handle different values per sample for "
                                "\"%s\"; tag ignored",
                                tagname);
                break;
            case TIFFReadDirEntryErrSizesan:
                TIFFWarningExtR(
                    tif, module,
                    "Sanity check on size of \"%s\" value failed; tag ignored",
                    tagname);
                break;
            case TIFFReadDirEntryErrAlloc:
                TIFFWarningExtR(tif, module,
                                "Out of memory reading of \"%s\"; tag ignored",
                                tagname);
                break;
            default:
                assert(0); /* we should never get here */
                break;
        }
    }
}